

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameCollaborativeGraphical.cpp
# Opt level: O0

void __thiscall
BayesianGameCollaborativeGraphical::AddLRF(BayesianGameCollaborativeGraphical *this,Scope *s)

{
  uint uVar1;
  bool bVar2;
  undefined8 uVar3;
  E *this_00;
  ulong uVar4;
  size_type sVar5;
  const_reference pvVar6;
  value_type *__x;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RSI;
  long *in_RDI;
  bool in_stack_00000027;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000028;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000030;
  size_t in_stack_00000038;
  BayesianGameIdenticalPayoff *in_stack_00000040;
  bool useSparseRewardModel;
  Index agentI;
  Index s_I;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nrTypes;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nrActions;
  size_t nrAgentsThisLRF;
  Index highestAgentI;
  Scope sSorted;
  Scope *in_stack_ffffffffffffff18;
  Scope *in_stack_ffffffffffffff20;
  vector<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_> *this_01;
  value_type_conflict2 *in_stack_ffffffffffffff28;
  Scope *in_stack_ffffffffffffff30;
  Scope *in_stack_ffffffffffffff40;
  Scope *in_stack_ffffffffffffff48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *arg;
  E *in_stack_ffffffffffffff50;
  uint local_74;
  
  Scope::Scope(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  Scope::Sort(in_stack_ffffffffffffff30);
  bVar2 = Scope::Equals(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  if (!bVar2) {
    uVar3 = __cxa_allocate_exception(0x28);
    E::E(in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
    __cxa_throw(uVar3,&E::typeinfo,E::~E);
  }
  bVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                    (&in_stack_ffffffffffffff30->super_SDT);
  if (!bVar2) {
    arg = in_RSI;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RSI);
    this_00 = (E *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                             (&in_stack_ffffffffffffff20->super_SDT,
                              (size_type)in_stack_ffffffffffffff18);
    uVar1 = *(uint *)&this_00->_vptr_E;
    uVar4 = (**(code **)(*in_RDI + 0x18))();
    if (uVar4 <= uVar1) {
      uVar3 = __cxa_allocate_exception(0x28);
      E::E(this_00,(char *)arg);
      __cxa_throw(uVar3,&E::typeinfo,E::~E);
    }
  }
  in_RDI[0x1b] = in_RDI[0x1b] + 1;
  sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RSI);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x8b0645);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x8b064f);
  for (local_74 = 0; local_74 < sVar5; local_74 = local_74 + 1) {
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (in_RSI,(ulong)local_74);
    uVar1 = *pvVar6;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x10),(ulong)uVar1
              );
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff30,
               in_stack_ffffffffffffff28);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x13),(ulong)uVar1
              );
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff30,
               in_stack_ffffffffffffff28);
  }
  this_01 = (vector<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_> *
            )(in_RDI + 0x1c);
  __x = (value_type *)operator_new(0xe8);
  BayesianGameIdenticalPayoff::BayesianGameIdenticalPayoff
            (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028,
             in_stack_00000027);
  std::vector<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>::
  push_back(this_01,(value_type *)in_stack_ffffffffffffff18);
  std::vector<Scope,_std::allocator<Scope>_>::push_back
            ((vector<Scope,_std::allocator<Scope>_> *)in_stack_ffffffffffffff30,__x);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff30);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff30);
  Scope::~Scope((Scope *)0x8b07a4);
  return;
}

Assistant:

void 
BayesianGameCollaborativeGraphical::AddLRF(const Scope &s)
{
    // check whether the scope is sorted, i.e., agent indices are in
    // ascending order
    Scope sSorted=s;
    sSorted.Sort();
    if(!sSorted.Equals(s))
        throw(E("BayesianGameCollaborativeGraphical::AddLRF() Scope should always be sorted"));

    if(! s.empty() )
    {
        Index highestAgentI = s.at(s.size()-1);
        if (highestAgentI >= GetNrAgents() )
            throw(E("BayesianGameCollaborativeGraphical::AddLRF() Scope contains non-existing agent!"));
    }

    _m_nrLRFs++;
    size_t nrAgentsThisLRF = s.size();
    vector<size_t> nrActions;
    vector<size_t> nrTypes;
    for(Index s_I = 0; s_I < nrAgentsThisLRF; s_I++)
    {
        Index agentI=s[s_I];
        nrActions.push_back( _m_nrActions[agentI] );
        nrTypes.push_back( _m_nrTypes[agentI] );
    }
    bool useSparseRewardModel=true;
    _m_LRFs.push_back( new BayesianGameIdenticalPayoff(nrAgentsThisLRF,
                                                       nrActions, nrTypes,
                                                       useSparseRewardModel ) );
    _m_agentScopes.push_back(s);
}